

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void ts_stack_delete(Stack *self)

{
  uint local_18;
  uint local_14;
  uint32_t i_1;
  uint32_t i;
  Stack *self_local;
  
  if ((self->slices).contents != (StackSlice *)0x0) {
    array__delete((VoidArray *)&self->slices);
  }
  if ((self->iterators).contents != (StackIterator *)0x0) {
    array__delete((VoidArray *)&self->iterators);
  }
  stack_node_release(self->base_node,&self->node_pool,self->subtree_pool);
  for (local_14 = 0; local_14 < (self->heads).size; local_14 = local_14 + 1) {
    stack_head_delete((self->heads).contents + local_14,&self->node_pool,self->subtree_pool);
  }
  (self->heads).size = 0;
  if ((self->node_pool).contents != (StackNode **)0x0) {
    for (local_18 = 0; local_18 < (self->node_pool).size; local_18 = local_18 + 1) {
      ts_free((self->node_pool).contents[local_18]);
    }
    array__delete((VoidArray *)&self->node_pool);
  }
  array__delete((VoidArray *)self);
  ts_free(self);
  return;
}

Assistant:

void ts_stack_delete(Stack *self) {
  if (self->slices.contents)
    array_delete(&self->slices);
  if (self->iterators.contents)
    array_delete(&self->iterators);
  stack_node_release(self->base_node, &self->node_pool, self->subtree_pool);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  if (self->node_pool.contents) {
    for (uint32_t i = 0; i < self->node_pool.size; i++)
      ts_free(self->node_pool.contents[i]);
    array_delete(&self->node_pool);
  }
  array_delete(&self->heads);
  ts_free(self);
}